

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
LinkedReadsDatastore::get_tag_reads
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          LinkedReadsDatastore *this,LinkedTag tag)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var1;
  pointer puVar2;
  ulong uVar3;
  LinkedTag local_2c;
  ulong local_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c = tag;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,10000);
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->read_tag).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->read_tag).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2c);
  puVar2 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)_Var1._M_current - (long)puVar2 >> 1 | 1;
  while (*(LinkedTag *)((long)puVar2 + uVar3 * 2 + -2) == local_2c) {
    local_28 = uVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
              (__return_storage_ptr__,(long *)&local_28);
    local_28 = uVar3 + 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<long>
              (__return_storage_ptr__,(long *)&local_28);
    uVar3 = uVar3 + 2;
    puVar2 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> LinkedReadsDatastore::get_tag_reads(LinkedTag tag) const {
    std::vector<uint64_t> rids;
    rids.reserve(10000);
    for (auto n=std::lower_bound(read_tag.begin(),read_tag.end(),tag)-read_tag.begin();read_tag[n]==tag;++n) {
        rids.emplace_back( n * 2 + 1);
        rids.emplace_back( n * 2 + 2);
    }
    return rids;
}